

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

void __thiscall TorController::connected_cb(TorController *this,TorControlConnection *_conn)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->reconnect_timeout = 1.0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"PROTOCOLINFO 1","");
  local_60._8_8_ = 0;
  local_60._M_unused._M_object = operator_new(0x18);
  *(code **)local_60._M_unused._0_8_ = protocolinfo_cb;
  *(undefined8 *)((long)local_60._M_unused._0_8_ + 8) = 0;
  *(TorController **)((long)local_60._M_unused._0_8_ + 0x10) = this;
  local_48 = std::
             _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
             ::_M_manager;
  bVar1 = TorControlConnection::Command(_conn,&local_40,(ReplyHandlerCB *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (!bVar1) {
    logging_function._M_str = "connected_cb";
    logging_function._M_len = 0xc;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x26e,ALL,Info,(ConstevalFormatString<0U>)0x80ab11);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorController::connected_cb(TorControlConnection& _conn)
{
    reconnect_timeout = RECONNECT_TIMEOUT_START;
    // First send a PROTOCOLINFO command to figure out what authentication is expected
    if (!_conn.Command("PROTOCOLINFO 1", std::bind(&TorController::protocolinfo_cb, this, std::placeholders::_1, std::placeholders::_2)))
        LogPrintf("tor: Error sending initial protocolinfo command\n");
}